

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O2

set<Map_*,_std::less<Map_*>,_std::allocator<Map_*>_> * __thiscall
Map::all_recursive_variants
          (set<Map_*,_std::less<Map_*>,_std::allocator<Map_*>_> *__return_storage_ptr__,Map *this)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  long lVar3;
  _Base_ptr p_Var4;
  _Rb_tree_node_base *p_Var5;
  set<Map_*,_std::less<Map_*>,_std::allocator<Map_*>_> previous_variants;
  _Rb_tree<Map_*,_Map_*,_std::_Identity<Map_*>,_std::less<Map_*>,_std::allocator<Map_*>_> local_60;
  
  p_Var2 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var4 = (this->_variants)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  for (; (_Rb_tree_header *)p_Var4 != &(this->_variants)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    std::_Rb_tree<Map*,Map*,std::_Identity<Map*>,std::less<Map*>,std::allocator<Map*>>::
    _M_insert_unique<Map*const&>
              ((_Rb_tree<Map*,Map*,std::_Identity<Map*>,std::less<Map*>,std::allocator<Map*>> *)
               __return_storage_ptr__,(Map **)(p_Var4 + 1));
  }
  do {
    std::_Rb_tree<Map_*,_Map_*,_std::_Identity<Map_*>,_std::less<Map_*>,_std::allocator<Map_*>_>::
    operator=(&local_60,&__return_storage_ptr__->_M_t);
    for (p_Var4 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != p_Var2; p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      lVar3 = *(long *)(p_Var4 + 1);
      for (p_Var5 = *(_Rb_tree_node_base **)(lVar3 + 0x60);
          p_Var5 != (_Rb_tree_node_base *)(lVar3 + 0x50);
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
        std::_Rb_tree<Map*,Map*,std::_Identity<Map*>,std::less<Map*>,std::allocator<Map*>>::
        _M_insert_unique<Map*const&>
                  ((_Rb_tree<Map*,Map*,std::_Identity<Map*>,std::less<Map*>,std::allocator<Map*>> *)
                   __return_storage_ptr__,(Map **)(p_Var5 + 1));
      }
    }
  } while (local_60._M_impl.super__Rb_tree_header._M_node_count <
           (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count);
  std::_Rb_tree<Map_*,_Map_*,_std::_Identity<Map_*>,_std::less<Map_*>,_std::allocator<Map_*>_>::
  ~_Rb_tree(&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::set<Map*> Map::all_recursive_variants() const
{
    std::set<Map*> previous_variants;
    std::set<Map*> current_variants;
    for(auto& [variant, _] : _variants)
        current_variants.insert(variant);

    do {
        previous_variants = current_variants;
        for(Map* map : previous_variants)
        {
            for(auto& [variant, _] : map->_variants)
                current_variants.insert(variant);
        }
    } while(current_variants.size() > previous_variants.size());

    return current_variants;
}